

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O1

void isobusfs_send_nack(int sock,isobusfs_msg *msg)

{
  int iVar1;
  undefined8 uVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  isobusfs_nack nack;
  sockaddr_can addr;
  undefined1 local_30;
  uint8_t local_2f;
  undefined2 local_2e;
  undefined1 local_2c;
  undefined2 local_2b;
  undefined1 local_29;
  undefined1 local_28 [16];
  undefined4 local_18;
  undefined4 uStack_14;
  
  uVar2 = *(undefined8 *)((long)&(msg->peername).can_addr + 8);
  local_28._0_8_ = *(undefined8 *)&msg->peername;
  local_28._8_8_ = (msg->peername).can_addr.tp;
  local_30 = 1;
  local_2f = msg->buf[0];
  local_2e = 0xffff;
  uStack_14._0_1_ = (undefined1)((ulong)uVar2 >> 0x20);
  local_2c = (undefined1)uStack_14;
  local_2b = *(undefined2 *)((long)&(msg->peername).can_addr + 8);
  local_29 = *(undefined1 *)((long)&(msg->peername).can_addr + 10);
  _local_18 = CONCAT44((int)((ulong)uVar2 >> 0x20),0xe800);
  sVar3 = sendto(sock,&local_30,8,0x40,(sockaddr *)local_28,0x18);
  if ((int)sVar3 < 0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    pcVar5 = strerror(-iVar1);
    isobusfs_log(LOG_LEVEL_WARN,"failed to send NACK: %i (%s)",(ulong)(uint)-iVar1,pcVar5);
  }
  isobusfs_log(LOG_LEVEL_DEBUG,"send NACK");
  return;
}

Assistant:

void isobusfs_send_nack(int sock, struct isobusfs_msg *msg)
{
	struct sockaddr_can addr = msg->peername;
	struct isobusfs_nack nack;
	int ret;

	nack.ctrl = ISOBUS_ACK_CTRL_NACK;
	nack.group_function = msg->buf[0];
	memset(&nack.reserved[0], 0xff, sizeof(nack.reserved));
	nack.address_nack = addr.can_addr.j1939.addr;
	memcpy(&nack.pgn_nack[0], &addr.can_addr.j1939.pgn,
		sizeof(nack.pgn_nack));

	addr.can_addr.j1939.pgn = ISOBUS_PGN_ACK;
	ret = sendto(sock, &nack, sizeof(nack), MSG_DONTWAIT,
			  (struct sockaddr *)&addr,
			   sizeof(addr));
	if (ret < 0) {
		ret = -errno;
		pr_warn("failed to send NACK: %i (%s)", ret, strerror(ret));
	}

	pr_debug("send NACK");
}